

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blas1_d.cpp
# Opt level: O0

double ddot(int n,double *dx,int incx,double *dy,int incy)

{
  int iVar1;
  int local_4c;
  int m;
  int iy;
  int ix;
  int i;
  double dtemp;
  int incy_local;
  double *dy_local;
  int incx_local;
  double *dx_local;
  double dStack_10;
  int n_local;
  
  _ix = 0.0;
  if (n < 1) {
    dStack_10 = 0.0;
  }
  else {
    if ((incx == 1) && (incy == 1)) {
      for (iy = 0; iVar1 = n % 5, iy < n % 5; iy = iy + 1) {
        _ix = dx[iy] * dy[iy] + _ix;
      }
      while (iy = iVar1, iy < n) {
        _ix = dx[iy + 4] * dy[iy + 4] +
              dx[iy + 3] * dy[iy + 3] +
              dx[iy + 2] * dy[iy + 2] + dx[iy + 1] * dy[iy + 1] + dx[iy] * dy[iy] + _ix;
        iVar1 = iy + 5;
      }
    }
    else {
      if (incx < 0) {
        m = (1 - n) * incx;
      }
      else {
        m = 0;
      }
      if (incy < 0) {
        local_4c = (1 - n) * incy;
      }
      else {
        local_4c = 0;
      }
      for (iy = 0; iy < n; iy = iy + 1) {
        _ix = dx[m] * dy[local_4c] + _ix;
        m = m + incx;
        local_4c = local_4c + incy;
      }
    }
    dStack_10 = _ix;
  }
  return dStack_10;
}

Assistant:

double ddot ( int n, double dx[], int incx, double dy[], int incy )

//****************************************************************************80
//
//  Purpose:
//
//    DDOT forms the dot product of two vectors.
//
//  Discussion:
//
//    This routine uses unrolled loops for increments equal to one.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    02 May 2005
//
//  Author:
//
//    Original FORTRAN77 version by Charles Lawson, Richard Hanson, 
//    David Kincaid, Fred Krogh.
//    C++ version by John Burkardt.
//
//  Reference:
//
//    Jack Dongarra, Jim Bunch, Cleve Moler, Pete Stewart,
//    LINPACK User's Guide,
//    SIAM, 1979,
//    ISBN13: 978-0-898711-72-1,
//    LC: QA214.L56.
//
//    Charles Lawson, Richard Hanson, David Kincaid, Fred Krogh,
//    Basic Linear Algebra Subprograms for Fortran Usage,
//    Algorithm 539,
//    ACM Transactions on Mathematical Software,
//    Volume 5, Number 3, September 1979, pages 308-323.
//
//  Parameters:
//
//    Input, int N, the number of entries in the vectors.
//
//    Input, double DX[*], the first vector.
//
//    Input, int INCX, the increment between successive entries in DX.
//
//    Input, double DY[*], the second vector.
//
//    Input, int INCY, the increment between successive entries in DY.
//
//    Output, double DDOT, the sum of the product of the corresponding
//    entries of DX and DY.
//
{
  double dtemp;
  int i;
  int ix;
  int iy;
  int m;

  dtemp = 0.0;

  if ( n <= 0 )
  {
    return dtemp;
  }
//
//  Code for unequal increments or equal increments
//  not equal to 1.
//
  if ( incx != 1 || incy != 1 )
  {
    if ( 0 <= incx )
    {
      ix = 0;
    }
    else
    {
      ix = ( - n + 1 ) * incx;
    }

    if ( 0 <= incy )
    {
      iy = 0;
    }
    else
    {
      iy = ( - n + 1 ) * incy;
    }

    for ( i = 0; i < n; i++ )
    {
      dtemp = dtemp + dx[ix] * dy[iy];
      ix = ix + incx;
      iy = iy + incy;
    }
  }
//
//  Code for both increments equal to 1.
//
  else
  {
    m = n % 5;

    for ( i = 0; i < m; i++ )
    {
      dtemp = dtemp + dx[i] * dy[i];
    }

    for ( i = m; i < n; i = i + 5 )
    {
      dtemp = dtemp + dx[i  ] * dy[i  ]
                    + dx[i+1] * dy[i+1]
                    + dx[i+2] * dy[i+2]
                    + dx[i+3] * dy[i+3]
                    + dx[i+4] * dy[i+4];
    }

  }

  return dtemp;
}